

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::
     serialize_container_helper<serialization::xml_oarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
               (xml_oarchive *ar,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *v)

{
  pointer pvVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *i;
  pointer v_00;
  
  xml_oarchive::save_sequence_start
            (ar,(size_type)
                (((long)(v->
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(v->
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x18));
  pvVar1 = (v->
           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (v_00 = (v->
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; v_00 != pvVar1; v_00 = v_00 + 1) {
    xml_oarchive::save_sequence_item_start(ar);
    serialize_container_helper<serialization::xml_oarchive,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
              (ar,v_00);
    ar->current_ = (ar->current_->super_xml_base<char>).m_parent;
  }
  ar->current_ = (ar->current_->super_xml_base<char>).m_parent;
  return;
}

Assistant:

inline void serialize_container_helper(Archive & ar, const T & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    ar.save_sequence_start(v.size());
    for(const auto & i : v)
    {
        ar.save_sequence_item_start();
        serialize_helper(ar, i);
        ar.save_sequence_item_end();
    }
    ar.save_sequence_end();
}